

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::applyIntPropertyValue
          (UnicodeSet *this,UCPMap *map,UCPMapValueFilter *filter,void *context,
          UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t local_3c;
  UChar32 local_38;
  uint32_t value;
  UChar32 end;
  UChar32 start;
  UErrorCode *errorCode_local;
  void *context_local;
  UCPMapValueFilter *filter_local;
  UCPMap *map_local;
  UnicodeSet *this_local;
  
  _end = errorCode;
  errorCode_local = (UErrorCode *)context;
  context_local = filter;
  filter_local = (UCPMapValueFilter *)map;
  map_local = (UCPMap *)this;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    clear(this);
    value = 0;
    while (local_38 = ucpmap_getRange_63((UCPMap *)filter_local,value,UCPMAP_RANGE_NORMAL,0,
                                         (UCPMapValueFilter *)context_local,errorCode_local,
                                         &local_3c), -1 < local_38) {
      if (local_3c != 0) {
        add(this,value,local_38);
      }
      value = local_38 + 1;
    }
    UVar1 = isBogus(this);
    if (UVar1 != '\0') {
      *_end = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

void UnicodeSet::applyIntPropertyValue(const UCPMap *map,
                                       UCPMapValueFilter *filter, const void *context,
                                       UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return; }
    clear();
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucpmap_getRange(map, start, UCPMAP_RANGE_NORMAL, 0,
                                  filter, context, &value)) >= 0) {
        if (value != 0) {
            add(start, end);
        }
        start = end + 1;
    }
    if (isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}